

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O1

void dg::dda::joinDefinitions(Definitions *from,Definitions *to,bool escaping)

{
  DefinitionsMap<dg::dda::RWNode> *this;
  _Base_ptr p_Var1;
  RWNode *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pointer pDVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  DiscreteInterval<dg::Offset> *undefInterv;
  pointer pDVar10;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  uncovered;
  DefSite local_70;
  Definitions *local_58;
  _Rb_tree_node_base *local_50;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  local_48;
  
  p_Var4 = Offset::UNKNOWN;
  p_Var9 = (from->definitions)._definitions._M_h._M_before_begin._M_nxt;
  local_58 = from;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    this = &to->definitions;
    p_Var1 = (_Base_ptr)((long)&Offset::UNKNOWN[-1]._M_right + 7);
    do {
      if (escaping) {
        this_00 = (RWNode *)p_Var9[1]._M_nxt;
        bVar6 = RWNode::isDynAlloc(this_00);
        if (((bVar6) || (this_00->type == GLOBAL)) || (this_00->has_address_taken == true))
        goto LAB_00111584;
      }
      else {
LAB_00111584:
        bVar6 = DefinitionsMap<dg::dda::RWNode>::definesTarget(this,(RWNode *)p_Var9[1]._M_nxt);
        if (bVar6) {
          p_Var8 = (_Rb_tree_node_base *)p_Var9[5]._M_nxt;
          local_50 = (_Rb_tree_node_base *)(p_Var9 + 3);
          if (p_Var8 != local_50) {
            do {
              p_Var2 = p_Var8[1]._M_parent;
              p_Var7 = p_Var4;
              if (p_Var2 != p_Var4) {
                p_Var3 = *(_Base_ptr *)(p_Var8 + 1);
                p_Var7 = (_Base_ptr)((long)p_Var2 - (long)p_Var3);
                if (p_Var2 < p_Var3) {
                  p_Var7 = p_Var4;
                }
                if (p_Var3 == p_Var4) {
                  p_Var7 = p_Var4;
                }
              }
              local_70.len.offset = (type)((long)&p_Var7->_M_color + 1);
              if (p_Var1 <= p_Var7) {
                local_70.len.offset = (type)p_Var4;
              }
              local_70.target = (RWNode *)p_Var9[1]._M_nxt;
              if (p_Var7 == p_Var4) {
                local_70.len.offset = (type)p_Var4;
              }
              local_70.offset.offset = *(type *)(p_Var8 + 1);
              DefinitionsMap<dg::dda::RWNode>::undefinedIntervals(&local_48,this,&local_70);
              pDVar5 = local_48.
                       super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (local_48.
                  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_48.
                  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pDVar10 = local_48.
                          super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  p_Var2 = (_Base_ptr)(pDVar10->end).offset;
                  p_Var7 = p_Var4;
                  if (p_Var2 != p_Var4) {
                    p_Var3 = (_Base_ptr)(pDVar10->start).offset;
                    p_Var7 = (_Base_ptr)((long)p_Var2 - (long)p_Var3);
                    if (p_Var2 < p_Var3) {
                      p_Var7 = p_Var4;
                    }
                    if (p_Var3 == p_Var4) {
                      p_Var7 = p_Var4;
                    }
                  }
                  local_70.len.offset = (type)((long)&p_Var7->_M_color + 1);
                  if (p_Var1 <= p_Var7) {
                    local_70.len.offset = (type)p_Var4;
                  }
                  local_70.target = (RWNode *)p_Var9[1]._M_nxt;
                  if (p_Var7 == p_Var4) {
                    local_70.len.offset = (type)p_Var4;
                  }
                  local_70.offset.offset = (pDVar10->start).offset;
                  DefinitionsMap<dg::dda::RWNode>::
                  add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                            (this,&local_70,
                             (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                              *)&p_Var8[1]._M_left);
                  pDVar10 = pDVar10 + 1;
                } while (pDVar10 != pDVar5);
              }
              if (local_48.
                  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.
                                super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_48.
                                      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.
                                      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
            } while (p_Var8 != local_50);
          }
        }
        else {
          DefinitionsMap<dg::dda::RWNode>::add
                    (this,(RWNode *)p_Var9[1]._M_nxt,(OffsetsT *)(p_Var9 + 2));
        }
      }
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>>
            ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&to->unknownWrites,
             (to->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (local_58->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (local_58->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

static void joinDefinitions(Definitions &from, Definitions &to,
                            bool escaping = false) {
    joinDefinitions(from.definitions, to.definitions, escaping);
    to.unknownWrites.insert(to.unknownWrites.end(), from.unknownWrites.begin(),
                            from.unknownWrites.end());
    // we ignore 'kills' and 'unknownReads' as this function is used
    // only when searching for all definitions
}